

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_targetvalue_0_Test::TestBody
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_targetvalue_0_Test *this)

{
  bool bVar1;
  void *pvVar2;
  char *pcVar3;
  CoinSelectionOption *in_R9;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  Amount AVar5;
  bool use_bnb;
  AssertHelper local_118;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  AssertHelper local_d0;
  Amount local_c8;
  Amount local_b8;
  Amount fee;
  Amount select_value;
  CoinSelectionOption option;
  
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0);
  local_b8.amount_ = AVar5.amount_;
  local_b8.ignore_check_ = AVar5.ignore_check_;
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0);
  local_c8.amount_ = AVar5.amount_;
  local_c8.ignore_check_ = AVar5.ignore_check_;
  use_bnb = false;
  GetBitcoinOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,0.0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    sVar4.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pvVar2 = (void *)0x0;
    if (bVar1) {
      GetBitcoinUtxoList();
      in_R9 = &option;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar,&exp_selection,&local_b8
                 ,(vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_,&exp_filter,in_R9,
                 &local_c8,&select_value,&fee,&use_bnb);
      sVar4 = gtest_ar.message_;
      pvVar2 = (void *)gtest_ar._0_8_;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_e8._M_allocated_capacity = 0;
      if (gtest_ar_._0_8_ != 0) {
        operator_delete((void *)gtest_ar_._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x92,
               "Expected: ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, option, tx_fee, &select_value, &fee, &use_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
    sVar4.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pvVar2 = (void *)0x0;
  }
  gtest_ar_._0_8_ = ((long)sVar4.ptr_ - (long)pvVar2 >> 3) * -0x7b425ed097b425ed;
  local_118.data_ = (AssertHelperData *)((ulong)local_118.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ret.size()","0",(unsigned_long *)&gtest_ar_,(int *)&local_118);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&select_value);
  local_118.data_ = local_118.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"select_value.GetSatoshiValue()","0",(long *)&gtest_ar_,
             (int *)&local_118);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_118.data_ = local_118.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","0",(long *)&gtest_ar_,(int *)&local_118)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,use_bnb) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (use_bnb != false) {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"use_bnb","true",
               "false",&in_R9->use_bnb_);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x97,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_e8) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    if (local_118.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_118.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_118.data_ + 8))();
      }
      local_118.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  option.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
  if (option.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(option.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_targetvalue_0)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(0);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(0);
  bool use_bnb = false;
  CoinSelectionOption option = GetBitcoinOption();
  option.SetEffectiveFeeBaserate(0.0);
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, option,
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(select_value.GetSatoshiValue(), 0);
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_FALSE(use_bnb);
}